

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O3

void __thiscall Timidity::Renderer::adjust_panning(Renderer *this,int chan)

{
  Voice *pVVar1;
  long lVar2;
  long lVar3;
  uint type;
  long lVar4;
  double pan;
  
  lVar4 = (long)this->voices;
  if (lVar4 != 0) {
    lVar3 = lVar4 * 0x170;
    do {
      pVVar1 = this->voice;
      if (((uint)(&pVVar1[-1].channel)[lVar3] == chan) &&
         ((((Voice *)(&pVVar1[-1].status + lVar3))->status & 1) != 0)) {
        pan = (double)(int)this->channel[chan].panning * 0.0078125;
        lVar2 = *(long *)((long)&pVVar1[-1].sample + lVar3);
        type = (uint)*(byte *)(lVar2 + 0x44);
        if (type == 2) {
          pan = pan + (double)(int)*(short *)(lVar2 + 0x48) * 0.002;
        }
        compute_pan(pan,type,(float *)((long)pVVar1[-1].vibrato_sample_increment + lVar3 + -0xc),
                    (float *)((long)pVVar1[-1].vibrato_sample_increment + lVar3 + -8));
        apply_envelope_to_amp((Voice *)(&pVVar1[-1].status + lVar3));
      }
      lVar4 = lVar4 + -1;
      lVar3 = lVar3 + -0x170;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void Renderer::adjust_panning(int chan)
{
	Channel *chanp = &channel[chan];
	int i = voices;
	while (i--)
	{
		Voice *v = &voice[i];
		if ((v->channel == chan) && (v->status & VOICE_RUNNING))
		{
			double pan = chanp->panning / 128.0;
			if (v->sample->type == INST_SF2)
			{ // Add instrument pan to channel pan.
				pan += v->sample->panning / 500.0;
			}
			compute_pan(pan, v->sample->type, v->left_offset, v->right_offset);
			apply_envelope_to_amp(v);
		}
	}
}